

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int disp_nt_opts(char *mesg,nt_opts *opts)

{
  FILE *__stream;
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (mesg != (char *)0x0) {
    fputs(mesg,_stderr);
  }
  if (opts == (nt_opts *)0x0) {
    fwrite("** disp_nt_opts: missing opts\n",0x1e,1,_stderr);
    iVar2 = -1;
  }
  else {
    fprintf(_stderr,
            "nt_opts @ %p\n   check_hdr, check_nim = %d, %d\n   diff_hdr, diff_nim   = %d, %d\n   disp_hdr, disp_nim   = %d, %d\n   disp_ana, disp_exts  = %d, %d\n   add_exts, rm_exts    = %d, %d\n   mod_hdr,  mod_nim    = %d, %d\n   swap_hdr, swap_ana   = %d, %d\n   swap_old             = %d\n   cbl, cci             = %d, %d\n   dts, dci_lines       = %d, %d\n   make_im              = %d\n"
            ,opts,(ulong)(uint)opts->check_hdr,(ulong)(uint)opts->check_nim,
            (ulong)(uint)opts->diff_hdr,(ulong)(uint)opts->diff_nim,(ulong)(uint)opts->disp_hdr,
            (ulong)(uint)opts->disp_nim,(ulong)(uint)opts->disp_ana,(ulong)(uint)opts->disp_exts,
            (ulong)(uint)opts->add_exts,(ulong)(uint)opts->rm_exts,(ulong)(uint)opts->mod_hdr,
            (ulong)(uint)opts->mod_nim,(ulong)(uint)opts->swap_hdr,(ulong)(uint)opts->swap_ana,
            (ulong)(uint)opts->swap_old,(ulong)(uint)opts->cbl,(ulong)(uint)opts->cci,
            (ulong)(uint)opts->dts,(ulong)(uint)opts->dci_lines,(ulong)(uint)opts->make_im);
    fwrite("   ci_dims[8]          = ",0x19,1,_stderr);
    disp_raw_data(opts->ci_dims,8,8,' ',1);
    fwrite("   new_dim[8]          = ",0x19,1,_stderr);
    disp_raw_data(opts->new_dim,8,8,' ',1);
    pcVar3 = "(NULL)";
    if (opts->prefix != (char *)0x0) {
      pcVar3 = opts->prefix;
    }
    fprintf(_stderr,
            "\n   new_datatype        = %d\n   debug, keep_hist    = %d, %d\n   overwrite           = %d\n   prefix              = \'%s\'\n"
            ,(ulong)(uint)opts->new_datatype,(ulong)(uint)opts->debug,(ulong)(uint)opts->keep_hist,
            (ulong)(uint)opts->overwrite);
    fprintf(_stderr,"   elist   (length %d)  :\n",(ulong)(uint)(opts->elist).len,pcVar3);
    for (uVar4 = 0; (long)uVar4 < (long)(opts->elist).len; uVar4 = uVar4 + 1) {
      fprintf(_stderr,"      %d : %s\n",uVar4 & 0xffffffff,(opts->elist).list[uVar4]);
    }
    fprintf(_stderr,"   etypes  (length %d)  : ",(ulong)(uint)(opts->etypes).len);
    disp_raw_data((opts->etypes).list,8,(opts->etypes).len,' ',0);
    fputc(10,_stderr);
    fprintf(_stderr,"   flist   (length %d)  :\n",(ulong)(uint)(opts->flist).len);
    for (uVar4 = 0; (long)uVar4 < (long)(opts->flist).len; uVar4 = uVar4 + 1) {
      fprintf(_stderr,"      %d : %s\n",uVar4 & 0xffffffff,(opts->flist).list[uVar4]);
    }
    fprintf(_stderr,"   vlist   (length %d)  :\n",(ulong)(uint)(opts->vlist).len);
    for (uVar4 = 0; (long)uVar4 < (long)(opts->vlist).len; uVar4 = uVar4 + 1) {
      fprintf(_stderr,"      %d : %s\n",uVar4 & 0xffffffff,(opts->vlist).list[uVar4]);
    }
    fprintf(_stderr,"   infiles (length %d)  :\n",(ulong)(uint)(opts->infiles).len);
    for (uVar4 = 0; __stream = _stderr, (long)uVar4 < (long)(opts->infiles).len; uVar4 = uVar4 + 1)
    {
      fprintf(_stderr,"      %d : %s\n",uVar4 & 0xffffffff,(opts->infiles).list[uVar4]);
    }
    sVar1 = strlen(opts->command);
    iVar2 = 0;
    fprintf(__stream,"   command len         : %d\n",sVar1 & 0xffffffff);
  }
  return iVar2;
}

Assistant:

int disp_nt_opts(char * mesg, nt_opts * opts)
{
   int c;

   if( mesg ) fputs(mesg, stderr);
   if( ! opts )
   {
      fprintf(stderr,"** disp_nt_opts: missing opts\n");
      return -1;
   }

   fprintf(stderr,"nt_opts @ %p\n"
                  "   check_hdr, check_nim = %d, %d\n"
                  "   diff_hdr, diff_nim   = %d, %d\n"
                  "   disp_hdr, disp_nim   = %d, %d\n"
                  "   disp_ana, disp_exts  = %d, %d\n"
                  "   add_exts, rm_exts    = %d, %d\n"
                  "   mod_hdr,  mod_nim    = %d, %d\n"
                  "   swap_hdr, swap_ana   = %d, %d\n"
                  "   swap_old             = %d\n"
                  "   cbl, cci             = %d, %d\n"
                  "   dts, dci_lines       = %d, %d\n"
                  "   make_im              = %d\n",
            (void *)opts,
            opts->check_hdr, opts->check_nim,
            opts->diff_hdr, opts->diff_nim, opts->disp_hdr, opts->disp_nim,
            opts->disp_ana, opts->disp_exts, opts->add_exts, opts->rm_exts,
            opts->mod_hdr, opts->mod_nim,
            opts->swap_hdr, opts->swap_ana, opts->swap_old,
            opts->cbl, opts->cci,
            opts->dts, opts->dci_lines, opts->make_im );

   fprintf(stderr,"   ci_dims[8]          = ");
   disp_raw_data(opts->ci_dims, DT_INT32, 8, ' ', 1);
   fprintf(stderr,"   new_dim[8]          = ");
   disp_raw_data(opts->new_dim, DT_INT32, 8, ' ', 1);

   fprintf(stderr,"\n"
                  "   new_datatype        = %d\n"
                  "   debug, keep_hist    = %d, %d\n"
                  "   overwrite           = %d\n"
                  "   prefix              = '%s'\n",
            opts->new_datatype, opts->debug, opts->keep_hist, opts->overwrite,
            opts->prefix ? opts->prefix : "(NULL)" );

   fprintf(stderr,"   elist   (length %d)  :\n", opts->elist.len);
   for( c = 0; c < opts->elist.len; c++ )
       fprintf(stderr,"      %d : %s\n", c, opts->elist.list[c]);

   fprintf(stderr,"   etypes  (length %d)  : ", opts->etypes.len);
   disp_raw_data(opts->etypes.list, DT_INT32, opts->etypes.len, ' ', 0);
   fputc('\n',stderr);

   fprintf(stderr,"   flist   (length %d)  :\n", opts->flist.len);
   for( c = 0; c < opts->flist.len; c++ )
       fprintf(stderr,"      %d : %s\n", c, opts->flist.list[c]);

   fprintf(stderr,"   vlist   (length %d)  :\n", opts->vlist.len);
   for( c = 0; c < opts->vlist.len; c++ )
       fprintf(stderr,"      %d : %s\n", c, opts->vlist.list[c]);

   fprintf(stderr,"   infiles (length %d)  :\n", opts->infiles.len);
   for( c = 0; c < opts->infiles.len; c++ )
       fprintf(stderr,"      %d : %s\n", c, opts->infiles.list[c]);

   fprintf(stderr,"   command len         : %d\n",(int)strlen(opts->command));

   return 0;
}